

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O2

Ptr<Instance> __thiscall
myvk::Instance::CreateWithGlfwExtensions
          (Instance *this,bool use_validation_layer,
          PFN_vkDebugUtilsMessengerCallbackEXT debug_callback)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  char **__first;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Instance> PVar3;
  shared_ptr<myvk::Instance> ret;
  uint32_t glfw_extension_count;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  VkInstanceCreateInfo local_108;
  char *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  VkValidationFeatureEnableEXT *pVStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  VkValidationFeatureEnableEXT validation_features_enabled [2];
  VkDebugUtilsMessengerCreateInfoEXT local_88;
  VkApplicationInfo local_58;
  
  std::make_shared<myvk::Instance>();
  local_108.pApplicationInfo = &local_58;
  local_58.pEngineName = (char *)0x0;
  local_58.pApplicationName = (char *)0x0;
  local_58.applicationVersion = 0;
  local_58._28_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_58._4_4_ = 0;
  local_58.pNext = (void *)0x0;
  local_58.engineVersion = 0;
  local_58.apiVersion = 0x403000;
  local_108.pNext = (allocator_type *)0x0;
  local_108.flags = 0;
  local_108._20_4_ = 0;
  local_108.enabledExtensionCount = 0;
  local_108._52_4_ = 0;
  local_108.ppEnabledExtensionNames = (char **)0x0;
  local_108.enabledLayerCount = 0;
  local_108._36_4_ = 0;
  local_108.ppEnabledLayerNames = (char **)0x0;
  local_108.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_108._4_4_ = 0;
  glfw_extension_count = 0;
  __first = glfwGetRequiredInstanceExtensions(&glfw_extension_count);
  std::vector<char_const*,std::allocator<char_const*>>::vector<char_const**,void>
            ((vector<char_const*,std::allocator<char_const*>> *)&extensions,__first,
             __first + glfw_extension_count,(allocator_type *)&local_c8);
  if (use_validation_layer) {
    local_c8 = "VK_EXT_debug_utils";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&extensions,&local_c8);
  }
  local_108.enabledExtensionCount =
       (uint32_t)
       ((ulong)((long)extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_108.ppEnabledExtensionNames =
       extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVStack_b0 = validation_features_enabled;
  validation_features_enabled[0] = VK_VALIDATION_FEATURE_ENABLE_BEST_PRACTICES_EXT;
  validation_features_enabled[1] = VK_VALIDATION_FEATURE_ENABLE_SYNCHRONIZATION_VALIDATION_EXT;
  uStack_c0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = (char *)0x3b9e8ed8;
  local_b8 = 2;
  if (use_validation_layer) {
    local_108.ppEnabledLayerNames = &kValidationLayers;
    local_108.pNext = (allocator_type *)&local_c8;
  }
  local_108.enabledLayerCount = (uint)use_validation_layer;
  if (((vkCreateInstance == (PFN_vkCreateInstance)0x0) &&
      (VVar2 = volkInitialize(), VVar2 != VK_SUCCESS)) ||
     (VVar2 = (*vkCreateInstance)(&local_108,(VkAllocationCallbacks *)0x0,
                                  &(ret.
                                    super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_instance), VVar2 != VK_SUCCESS)) {
LAB_0019140b:
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    volkLoadInstanceOnly
              ((ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_instance);
    if (use_validation_layer && debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) {
      local_88.pNext = (void *)0x0;
      local_88.flags = 0;
      local_88._28_4_ = 0;
      local_88.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
      local_88._4_4_ = 0;
      local_88.messageSeverity = 0x1111;
      local_88.messageType = 7;
      local_88.pUserData = (void *)0x0;
      local_88.pfnUserCallback = debug_callback;
      VVar2 = (*vkCreateDebugUtilsMessengerEXT)
                        ((ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->m_instance,&local_88,(VkAllocationCallbacks *)0x0,
                         &(ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_debug_messenger);
      if (VVar2 != VK_SUCCESS) goto LAB_0019140b;
    }
    _Var1._M_pi = ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Base)._vptr_Base =
         (_func_int **)ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
    ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar3.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Instance>)PVar3.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Instance> Instance::CreateWithGlfwExtensions(bool use_validation_layer,
                                                 PFN_vkDebugUtilsMessengerCallbackEXT debug_callback) {
	auto ret = std::make_shared<Instance>();

	VkApplicationInfo app_info = {};
	app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
	app_info.apiVersion = VK_API_VERSION_1_3;

	VkInstanceCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
	create_info.pApplicationInfo = &app_info;

	uint32_t glfw_extension_count = 0;
	const char **glfw_extensions = glfwGetRequiredInstanceExtensions(&glfw_extension_count);
	std::vector<const char *> extensions(glfw_extensions, glfw_extensions + glfw_extension_count);
	if (use_validation_layer)
		extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);

	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();

	VkValidationFeatureEnableEXT validation_features_enabled[] = {
	    VK_VALIDATION_FEATURE_ENABLE_BEST_PRACTICES_EXT, VK_VALIDATION_FEATURE_ENABLE_SYNCHRONIZATION_VALIDATION_EXT};
	VkValidationFeaturesEXT validation_features = {};
	validation_features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
	validation_features.enabledValidationFeatureCount =
	    sizeof(validation_features_enabled) / sizeof(VkValidationFeatureEnableEXT);
	validation_features.pEnabledValidationFeatures = validation_features_enabled;

	if (use_validation_layer) {
		create_info.enabledLayerCount = sizeof(kValidationLayers) / sizeof(const char *);
		create_info.ppEnabledLayerNames = kValidationLayers;

		validation_features.pNext = create_info.pNext;
		create_info.pNext = &validation_features;
	} else
		create_info.enabledLayerCount = 0;

	if (vkCreateInstance == nullptr) {
		if (volkInitialize() != VK_SUCCESS)
			return nullptr;
	}

	if (vkCreateInstance(&create_info, nullptr, &ret->m_instance) != VK_SUCCESS)
		return nullptr;
	volkLoadInstanceOnly(ret->m_instance);

	if (use_validation_layer && debug_callback) {
		VkDebugUtilsMessengerCreateInfoEXT debug_info = {};
		debug_info.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
		debug_info.messageSeverity =
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT;
		debug_info.messageType = VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
		debug_info.pfnUserCallback = debug_callback;
		debug_info.pUserData = nullptr;

		if (vkCreateDebugUtilsMessengerEXT(ret->m_instance, &debug_info, nullptr, &ret->m_debug_messenger) !=
		    VK_SUCCESS)
			return nullptr;
	}

	return ret;
}